

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.h
# Opt level: O0

char * FindMESMessage(char *str)

{
  int iVar1;
  size_t sVar2;
  int local_24;
  char *pcStack_20;
  int len;
  char *foundstr;
  char *str_local;
  
  sVar2 = strlen(str);
  local_24 = (int)sVar2;
  pcStack_20 = str;
  do {
    iVar1 = AnalyzeMESMessage(pcStack_20,local_24);
    if (iVar1 == 0) {
      return pcStack_20;
    }
    pcStack_20 = pcStack_20 + 1;
    local_24 = local_24 + -1;
  } while (9 < local_24);
  return (char *)0x0;
}

Assistant:

inline char* FindMESMessage(char* str)
{
	char* foundstr = str;
	int len = (int)strlen(str);

	while (AnalyzeMESMessage(foundstr, len) != EXIT_SUCCESS)
	{
		foundstr++;
		len--;
		if (len < MESSAGE_LEN_MES) 
		{
			// Could not find the message.
			return NULL;
		}
	}

	return foundstr;
}